

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O0

void prvTidyPushInline(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  Lexer *pLVar2;
  Bool BVar3;
  IStack *pIVar4;
  tmbstr ptVar5;
  AttVal *pAVar6;
  IStack *istack;
  Lexer *lexer;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pLVar2 = doc->lexer;
  if (((node->implicit == no) && (BVar3 = IsNodePushable(node), BVar3 != no)) &&
     (((node != (Node *)0x0 && ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_FONT)))) ||
      (BVar3 = prvTidyIsPushed(doc,node), BVar3 == no)))) {
    if (pLVar2->istacklength < pLVar2->istacksize + 1) {
      if (pLVar2->istacklength == 0) {
        pLVar2->istacklength = 6;
      }
      pLVar2->istacklength = pLVar2->istacklength << 1;
      pIVar4 = (IStack *)
               (*doc->allocator->vtbl->realloc)
                         (doc->allocator,pLVar2->istack,(ulong)pLVar2->istacklength << 5);
      pLVar2->istack = pIVar4;
    }
    pIVar4 = pLVar2->istack;
    uVar1 = pLVar2->istacksize;
    pIVar4[uVar1].tag = node->tag;
    ptVar5 = prvTidytmbstrdup(doc->allocator,node->element);
    pIVar4[uVar1].element = ptVar5;
    pAVar6 = prvTidyDupAttrs(doc,node->attributes);
    pIVar4[uVar1].attributes = pAVar6;
    pLVar2->istacksize = pLVar2->istacksize + 1;
  }
  return;
}

Assistant:

void TY_(PushInline)( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;
    IStack *istack;

    if (node->implicit)
        return;

    if ( !IsNodePushable(node) )
        return;

    if ( !nodeIsFONT(node) && TY_(IsPushed)(doc, node) )
        return;

    /* make sure there is enough space for the stack */
    if (lexer->istacksize + 1 > lexer->istacklength)
    {
        if (lexer->istacklength == 0)
            lexer->istacklength = 6;   /* this is perhaps excessive */

        lexer->istacklength = lexer->istacklength * 2;
        lexer->istack = (IStack *)TidyDocRealloc(doc, lexer->istack,
                            sizeof(IStack)*(lexer->istacklength));
    }

    istack = &(lexer->istack[lexer->istacksize]);
    istack->tag = node->tag;

    istack->element = TY_(tmbstrdup)(doc->allocator, node->element);
    istack->attributes = TY_(DupAttrs)( doc, node->attributes );
    ++(lexer->istacksize);
}